

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int io_tmpfile(lua_State *L)

{
  int iVar1;
  LStream *pLVar2;
  FILE *pFVar3;
  
  pLVar2 = newfile(L);
  pFVar3 = tmpfile64();
  pLVar2->f = (FILE *)pFVar3;
  if (pFVar3 != (FILE *)0x0) {
    return 1;
  }
  iVar1 = luaL_fileresult(L,0,(char *)0x0);
  return iVar1;
}

Assistant:

static int io_tmpfile(lua_State *L) {
    LStream *p = newfile(L);
    p->f = tmpfile();
    return (p->f == NULL) ? luaL_fileresult(L, 0, NULL) : 1;
}